

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * kwssys::SystemTools::AddSpaceBetweenCapitalizedWords(string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RSI;
  string *in_RDI;
  size_t i;
  string *n;
  undefined8 local_30;
  
  std::__cxx11::string::string((string *)in_RDI);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::reserve((ulong)in_RDI);
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
    std::__cxx11::string::operator+=((string *)in_RDI,*pcVar3);
    for (local_30 = 1; uVar2 = std::__cxx11::string::size(), local_30 < uVar2;
        local_30 = local_30 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
      iVar1 = isupper((int)*pcVar3);
      if (iVar1 != 0) {
        pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
        iVar1 = isspace((int)*pcVar3);
        if (iVar1 == 0) {
          pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
          iVar1 = isupper((int)*pcVar3);
          if (iVar1 == 0) {
            std::__cxx11::string::operator+=((string *)in_RDI,' ');
          }
        }
      }
      pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
      std::__cxx11::string::operator+=((string *)in_RDI,*pcVar3);
    }
  }
  return in_RDI;
}

Assistant:

std::string SystemTools::AddSpaceBetweenCapitalizedWords(const std::string& s)
{
  std::string n;
  if (!s.empty()) {
    n.reserve(s.size());
    n += s[0];
    for (size_t i = 1; i < s.size(); i++) {
      if (isupper(s[i]) && !isspace(s[i - 1]) && !isupper(s[i - 1])) {
        n += ' ';
      }
      n += s[i];
    }
  }
  return n;
}